

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::avx2::
     BVHNIntersectorKHybrid<8,_8,_257,_false,_embree::avx2::VirtualCurveIntersectorK<8>,_true>::
     occluded(vint<8> *valid_i,Intersectors *This,RayK<8> *ray,RayQueryContext *context)

{
  BVH *bvh;
  size_t sVar1;
  RTCRayQueryContext *pRVar2;
  RTCIntersectArguments *pRVar3;
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  char cVar12;
  bool bVar13;
  int iVar14;
  undefined4 uVar15;
  RTCIntersectArguments *pRVar16;
  uint uVar17;
  uint uVar18;
  ulong uVar19;
  ulong *puVar20;
  long lVar21;
  RTCRayQueryContext *pRVar22;
  ulong uVar23;
  NodeRef root;
  undefined1 (*pauVar24) [32];
  float fVar25;
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  float fVar30;
  float fVar31;
  float fVar32;
  undefined1 in_ZMM1 [64];
  float fVar33;
  float fVar40;
  float fVar41;
  float fVar42;
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [64];
  undefined1 auVar48 [16];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar53 [16];
  undefined1 auVar52 [16];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 in_ZMM5 [64];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [16];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  vfloat4 a0;
  undefined1 auVar70 [16];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [32];
  undefined1 auVar76 [64];
  undefined1 auVar77 [16];
  undefined1 auVar78 [32];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [64];
  undefined1 auVar82 [32];
  vbool<8> terminated;
  vbool<8> valid_o;
  TravRayK<8,_false> tray;
  Precalculations pre;
  NodeRef stack_node [561];
  vfloat<8> stack_near [561];
  undefined1 local_5ca0 [32];
  undefined1 local_5c80 [32];
  undefined1 local_5c60 [32];
  undefined1 local_5c40 [32];
  anon_union_96_2_4062524c_for_Vec3<embree::vfloat_impl<8>_>_1 local_5c20;
  undefined1 local_5bc0 [32];
  undefined1 local_5ba0 [32];
  undefined1 local_5b80 [8];
  float fStack_5b78;
  float fStack_5b74;
  float fStack_5b70;
  float fStack_5b6c;
  float fStack_5b68;
  undefined1 local_5b60 [32];
  undefined1 local_5b40 [32];
  undefined1 local_5b20 [32];
  float local_5b00;
  float fStack_5afc;
  float fStack_5af8;
  float fStack_5af4;
  float fStack_5af0;
  float fStack_5aec;
  float fStack_5ae8;
  undefined4 uStack_5ae4;
  float local_5ae0;
  float fStack_5adc;
  float fStack_5ad8;
  float fStack_5ad4;
  float fStack_5ad0;
  float fStack_5acc;
  float fStack_5ac8;
  undefined4 uStack_5ac4;
  float local_5ac0;
  float fStack_5abc;
  float fStack_5ab8;
  float fStack_5ab4;
  float fStack_5ab0;
  float fStack_5aac;
  float fStack_5aa8;
  undefined4 uStack_5aa4;
  undefined1 local_5aa0 [32];
  undefined1 local_5a80 [32];
  undefined1 local_5a60 [32];
  undefined1 local_5a40 [32];
  undefined1 local_5a20 [32];
  undefined1 local_5a00 [32];
  undefined8 local_59e0;
  undefined8 uStack_59d8;
  undefined8 uStack_59d0;
  undefined8 uStack_59c8;
  anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1 local_59c0;
  RTCIntersectArguments local_59a0;
  undefined1 auStack_5980 [368];
  undefined8 local_5810;
  size_t local_5808;
  ulong local_5800 [560];
  undefined1 local_4680 [32];
  undefined1 local_4660 [32];
  undefined1 local_4640 [17936];
  undefined1 auVar83 [64];
  
  bvh = (BVH *)This->ptr;
  sVar1 = (bvh->root).ptr;
  if (sVar1 != 8) {
    auVar43 = vpcmpeqd_avx2(in_ZMM1._0_32_,in_ZMM1._0_32_);
    auVar39 = *(undefined1 (*) [32])(ray + 0x100);
    auVar34 = vpcmpeqd_avx2(auVar43,(undefined1  [32])valid_i->field_0);
    auVar43 = vcmpps_avx(auVar39,ZEXT1632(ZEXT816(0) << 0x40),5);
    auVar43 = vandps_avx(auVar43,auVar34);
    uVar17 = vmovmskps_avx(auVar43);
    if (uVar17 != 0) {
      auVar53 = vpackssdw_avx(auVar43._0_16_,auVar43._16_16_);
      local_5bc0 = *(undefined1 (*) [32])(ray + 0x80);
      local_5ba0 = *(undefined1 (*) [32])(ray + 0xa0);
      _local_5b80 = *(undefined1 (*) [32])(ray + 0xc0);
      auVar76._0_4_ = local_5b80._0_4_ * local_5b80._0_4_;
      auVar76._4_4_ = local_5b80._4_4_ * local_5b80._4_4_;
      auVar76._8_4_ = local_5b80._8_4_ * local_5b80._8_4_;
      auVar76._12_4_ = local_5b80._12_4_ * local_5b80._12_4_;
      auVar76._16_4_ = local_5b80._16_4_ * local_5b80._16_4_;
      auVar76._20_4_ = local_5b80._20_4_ * local_5b80._20_4_;
      auVar76._28_36_ = in_ZMM5._28_36_;
      auVar76._24_4_ = local_5b80._24_4_ * local_5b80._24_4_;
      auVar58 = vfmadd231ps_fma(auVar76._0_32_,local_5ba0,local_5ba0);
      auVar58 = vfmadd231ps_fma(ZEXT1632(auVar58),local_5bc0,local_5bc0);
      auVar43 = vrsqrtps_avx(ZEXT1632(auVar58));
      pRVar16 = &local_59a0;
      uVar19 = (ulong)(uVar17 & 0xff);
      fVar25 = auVar43._0_4_;
      fVar30 = auVar43._4_4_;
      fVar31 = auVar43._8_4_;
      fVar32 = auVar43._12_4_;
      fVar33 = auVar43._16_4_;
      fVar40 = auVar43._20_4_;
      fVar41 = auVar43._24_4_;
      auVar34._4_4_ = fVar30 * fVar30 * fVar30 * auVar58._4_4_ * -0.5;
      auVar34._0_4_ = fVar25 * fVar25 * fVar25 * auVar58._0_4_ * -0.5;
      auVar34._8_4_ = fVar31 * fVar31 * fVar31 * auVar58._8_4_ * -0.5;
      auVar34._12_4_ = fVar32 * fVar32 * fVar32 * auVar58._12_4_ * -0.5;
      auVar34._16_4_ = fVar33 * fVar33 * fVar33 * -0.0;
      auVar34._20_4_ = fVar40 * fVar40 * fVar40 * -0.0;
      auVar34._24_4_ = fVar41 * fVar41 * fVar41 * -0.0;
      auVar34._28_4_ = 0;
      auVar64._8_4_ = 0x3fc00000;
      auVar64._0_8_ = 0x3fc000003fc00000;
      auVar64._12_4_ = 0x3fc00000;
      auVar64._16_4_ = 0x3fc00000;
      auVar64._20_4_ = 0x3fc00000;
      auVar64._24_4_ = 0x3fc00000;
      auVar64._28_4_ = 0x3fc00000;
      auVar58 = vfmadd213ps_fma(auVar64,auVar43,auVar34);
      local_59c0 = (anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1)ZEXT1632(auVar58);
      auVar52._8_4_ = 0x80000000;
      auVar52._0_8_ = 0x8000000080000000;
      auVar52._12_4_ = 0x80000000;
      auVar58._12_4_ = 0;
      auVar58._0_12_ = ZEXT812(0);
      auVar58 = auVar58 << 0x20;
      do {
        lVar21 = 0;
        for (uVar23 = uVar19; (uVar23 & 1) == 0; uVar23 = uVar23 >> 1 | 0x8000000000000000) {
          lVar21 = lVar21 + 1;
        }
        uVar23 = (ulong)(uint)((int)lVar21 * 4);
        auVar67 = vinsertps_avx(ZEXT416(*(uint *)(ray + uVar23 + 0x80)),
                                ZEXT416(*(uint *)(ray + uVar23 + 0xa0)),0x1c);
        auVar67 = vinsertps_avx(auVar67,ZEXT416(*(uint *)(ray + uVar23 + 0xc0)),0x28);
        fVar25 = *(float *)((long)&local_59c0 + uVar23);
        auVar70._0_4_ = auVar67._0_4_ * fVar25;
        auVar70._4_4_ = auVar67._4_4_ * fVar25;
        auVar70._8_4_ = auVar67._8_4_ * fVar25;
        auVar70._12_4_ = auVar67._12_4_ * fVar25;
        auVar77 = vshufpd_avx(auVar70,auVar70,1);
        auVar67 = vmovshdup_avx(auVar70);
        auVar74 = vunpckhps_avx(auVar70,auVar58);
        auVar73._0_8_ = auVar77._0_8_ ^ 0x8000000080000000;
        auVar73._8_8_ = auVar77._8_8_ ^ auVar52._8_8_;
        auVar73 = vinsertps_avx(auVar73,auVar70,0x2a);
        auVar74 = vshufps_avx(auVar74,ZEXT416(auVar67._0_4_ ^ 0x80000000),0x41);
        auVar67 = vdpps_avx(auVar73,auVar73,0x7f);
        auVar77 = vdpps_avx(auVar74,auVar74,0x7f);
        auVar67 = vcmpps_avx(auVar67,auVar77,1);
        auVar79._0_4_ = auVar67._0_4_;
        auVar79._4_4_ = auVar79._0_4_;
        auVar79._8_4_ = auVar79._0_4_;
        auVar79._12_4_ = auVar79._0_4_;
        auVar67 = vblendvps_avx(auVar73,auVar74,auVar79);
        auVar77 = vdpps_avx(auVar67,auVar67,0x7f);
        auVar73 = vrsqrtss_avx(auVar77,auVar77);
        fVar30 = auVar73._0_4_;
        fVar30 = fVar30 * 1.5 - auVar77._0_4_ * 0.5 * fVar30 * fVar30 * fVar30;
        auVar74._0_4_ = auVar67._0_4_ * fVar30;
        auVar74._4_4_ = auVar67._4_4_ * fVar30;
        auVar74._8_4_ = auVar67._8_4_ * fVar30;
        auVar74._12_4_ = auVar67._12_4_ * fVar30;
        auVar67 = vshufps_avx(auVar74,auVar74,0xc9);
        auVar77 = vshufps_avx(auVar70,auVar70,0xc9);
        auVar80._0_4_ = auVar74._0_4_ * auVar77._0_4_;
        auVar80._4_4_ = auVar74._4_4_ * auVar77._4_4_;
        auVar80._8_4_ = auVar74._8_4_ * auVar77._8_4_;
        auVar80._12_4_ = auVar74._12_4_ * auVar77._12_4_;
        auVar67 = vfmsub231ps_fma(auVar80,auVar70,auVar67);
        auVar73 = vshufps_avx(auVar67,auVar67,0xc9);
        auVar67 = vdpps_avx(auVar73,auVar73,0x7f);
        lVar21 = lVar21 * 0x30;
        auVar77 = vrsqrtss_avx(auVar67,auVar67);
        fVar30 = auVar77._0_4_;
        fVar30 = fVar30 * 1.5 - auVar67._0_4_ * 0.5 * fVar30 * fVar30 * fVar30;
        uVar19 = uVar19 - 1 & uVar19;
        auVar77._0_4_ = fVar30 * auVar73._0_4_;
        auVar77._4_4_ = fVar30 * auVar73._4_4_;
        auVar77._8_4_ = fVar30 * auVar73._8_4_;
        auVar77._12_4_ = fVar30 * auVar73._12_4_;
        auVar67._0_4_ = fVar25 * auVar70._0_4_;
        auVar67._4_4_ = fVar25 * auVar70._4_4_;
        auVar67._8_4_ = fVar25 * auVar70._8_4_;
        auVar67._12_4_ = fVar25 * auVar70._12_4_;
        auVar73 = vunpcklps_avx(auVar74,auVar67);
        auVar67 = vunpckhps_avx(auVar74,auVar67);
        auVar74 = vunpcklps_avx(auVar77,auVar58);
        auVar77 = vunpckhps_avx(auVar77,auVar58);
        auVar77 = vunpcklps_avx(auVar67,auVar77);
        auVar70 = vunpcklps_avx(auVar73,auVar74);
        auVar67 = vunpckhps_avx(auVar73,auVar74);
        ((RayQueryContext *)((long)pRVar16 + lVar21))->scene = (Scene *)auVar70._0_8_;
        ((RayQueryContext *)((long)pRVar16 + lVar21))->user = (RTCRayQueryContext *)auVar70._8_8_;
        *(undefined1 (*) [16])(auStack_5980 + lVar21 + -0x10) = auVar67;
        *(undefined1 (*) [16])(auStack_5980 + lVar21) = auVar77;
      } while (uVar19 != 0);
      local_5c20._0_4_ = *(undefined4 *)ray;
      local_5c20._4_4_ = *(undefined4 *)(ray + 4);
      local_5c20._8_4_ = *(undefined4 *)(ray + 8);
      local_5c20._12_4_ = *(undefined4 *)(ray + 0xc);
      local_5c20._16_4_ = *(undefined4 *)(ray + 0x10);
      local_5c20._20_4_ = *(undefined4 *)(ray + 0x14);
      local_5c20._24_4_ = *(undefined4 *)(ray + 0x18);
      local_5c20._28_4_ = *(undefined4 *)(ray + 0x1c);
      local_5c20._32_4_ = *(undefined4 *)(ray + 0x20);
      local_5c20._36_4_ = *(undefined4 *)(ray + 0x24);
      local_5c20._40_4_ = *(undefined4 *)(ray + 0x28);
      local_5c20._44_4_ = *(undefined4 *)(ray + 0x2c);
      local_5c20._48_4_ = *(undefined4 *)(ray + 0x30);
      local_5c20._52_4_ = *(undefined4 *)(ray + 0x34);
      local_5c20._56_4_ = *(undefined4 *)(ray + 0x38);
      local_5c20._60_4_ = *(undefined4 *)(ray + 0x3c);
      local_5c20.field_0.z.field_0 = (vfloat_impl<8>)*(undefined1 (*) [32])(ray + 0x40);
      local_5c60._8_4_ = 0x7fffffff;
      local_5c60._0_8_ = 0x7fffffff7fffffff;
      local_5c60._12_4_ = 0x7fffffff;
      local_5c60._16_4_ = 0x7fffffff;
      local_5c60._20_4_ = 0x7fffffff;
      local_5c60._24_4_ = 0x7fffffff;
      local_5c60._28_4_ = 0x7fffffff;
      auVar81 = ZEXT3264(local_5c60);
      auVar43 = vandps_avx(local_5c60,local_5bc0);
      auVar82._8_4_ = 0x219392ef;
      auVar82._0_8_ = 0x219392ef219392ef;
      auVar82._12_4_ = 0x219392ef;
      auVar82._16_4_ = 0x219392ef;
      auVar82._20_4_ = 0x219392ef;
      auVar82._24_4_ = 0x219392ef;
      auVar82._28_4_ = 0x219392ef;
      auVar83 = ZEXT3264(auVar82);
      auVar43 = vcmpps_avx(auVar43,auVar82,1);
      auVar34 = vblendvps_avx(local_5bc0,auVar82,auVar43);
      auVar43 = vandps_avx(local_5c60,local_5ba0);
      auVar43 = vcmpps_avx(auVar43,auVar82,1);
      auVar64 = vblendvps_avx(local_5ba0,auVar82,auVar43);
      auVar43 = vandps_avx(local_5c60,_local_5b80);
      auVar43 = vcmpps_avx(auVar43,auVar82,1);
      auVar49 = vrcpps_avx(auVar34);
      auVar43 = vblendvps_avx(_local_5b80,auVar82,auVar43);
      auVar71._8_4_ = 0x3f800000;
      auVar71._0_8_ = 0x3f8000003f800000;
      auVar71._12_4_ = 0x3f800000;
      auVar71._16_4_ = 0x3f800000;
      auVar71._20_4_ = 0x3f800000;
      auVar71._24_4_ = 0x3f800000;
      auVar71._28_4_ = 0x3f800000;
      auVar54 = vrcpps_avx(auVar64);
      auVar58 = vfnmadd213ps_fma(auVar34,auVar49,auVar71);
      auVar58 = vfmadd132ps_fma(ZEXT1632(auVar58),auVar49,auVar49);
      auVar52 = vfnmadd213ps_fma(auVar64,auVar54,auVar71);
      auVar52 = vfmadd132ps_fma(ZEXT1632(auVar52),auVar54,auVar54);
      auVar34 = vrcpps_avx(auVar43);
      auVar67 = vfnmadd213ps_fma(auVar43,auVar34,auVar71);
      auVar67 = vfmadd132ps_fma(ZEXT1632(auVar67),auVar34,auVar34);
      local_5b60 = ZEXT1632(auVar58);
      local_5b40 = ZEXT1632(auVar52);
      local_5b20 = ZEXT1632(auVar67);
      local_5b00 = auVar58._0_4_ * (float)local_5c20._0_4_;
      fStack_5afc = auVar58._4_4_ * (float)local_5c20._4_4_;
      fStack_5af8 = auVar58._8_4_ * (float)local_5c20._8_4_;
      fStack_5af4 = auVar58._12_4_ * (float)local_5c20._12_4_;
      fStack_5af0 = (float)local_5c20._16_4_ * 0.0;
      fStack_5aec = (float)local_5c20._20_4_ * 0.0;
      uStack_5ae4 = auVar34._28_4_;
      fStack_5ae8 = (float)local_5c20._24_4_ * 0.0;
      local_5ae0 = (float)local_5c20._32_4_ * auVar52._0_4_;
      fStack_5adc = (float)local_5c20._36_4_ * auVar52._4_4_;
      fStack_5ad8 = (float)local_5c20._40_4_ * auVar52._8_4_;
      fStack_5ad4 = (float)local_5c20._44_4_ * auVar52._12_4_;
      fStack_5ad0 = (float)local_5c20._48_4_ * 0.0;
      fStack_5acc = (float)local_5c20._52_4_ * 0.0;
      fStack_5ac8 = (float)local_5c20._56_4_ * 0.0;
      local_5ac0 = local_5c20._64_4_ * auVar67._0_4_;
      fStack_5abc = local_5c20._68_4_ * auVar67._4_4_;
      fStack_5ab8 = local_5c20._72_4_ * auVar67._8_4_;
      fStack_5ab4 = local_5c20._76_4_ * auVar67._12_4_;
      fStack_5ab0 = local_5c20._80_4_ * 0.0;
      fStack_5aac = local_5c20._84_4_ * 0.0;
      fStack_5aa8 = local_5c20._88_4_ * 0.0;
      auVar34 = ZEXT1232(ZEXT412(0)) << 0x20;
      auVar43 = vcmpps_avx(local_5b60,auVar34,1);
      auVar60._8_4_ = 0x20;
      auVar60._0_8_ = 0x2000000020;
      auVar60._12_4_ = 0x20;
      auVar60._16_4_ = 0x20;
      auVar60._20_4_ = 0x20;
      auVar60._24_4_ = 0x20;
      auVar60._28_4_ = 0x20;
      local_5aa0 = vandps_avx(auVar43,auVar60);
      auVar54._8_4_ = 0x40;
      auVar54._0_8_ = 0x4000000040;
      auVar54._12_4_ = 0x40;
      auVar54._16_4_ = 0x40;
      auVar54._20_4_ = 0x40;
      auVar54._24_4_ = 0x40;
      auVar54._28_4_ = 0x40;
      auVar61._8_4_ = 0x60;
      auVar61._0_8_ = 0x6000000060;
      auVar61._12_4_ = 0x60;
      auVar61._16_4_ = 0x60;
      auVar61._20_4_ = 0x60;
      auVar61._24_4_ = 0x60;
      auVar61._28_4_ = 0x60;
      auVar43 = vcmpps_avx(ZEXT1632(auVar52),auVar34,5);
      local_5a80 = vblendvps_avx(auVar61,auVar54,auVar43);
      auVar49._8_4_ = 0x80;
      auVar49._0_8_ = 0x8000000080;
      auVar49._12_4_ = 0x80;
      auVar49._16_4_ = 0x80;
      auVar49._20_4_ = 0x80;
      auVar49._24_4_ = 0x80;
      auVar49._28_4_ = 0x80;
      auVar55._8_4_ = 0xa0;
      auVar55._0_8_ = 0xa0000000a0;
      auVar55._12_4_ = 0xa0;
      auVar55._16_4_ = 0xa0;
      auVar55._20_4_ = 0xa0;
      auVar55._24_4_ = 0xa0;
      auVar55._28_4_ = 0xa0;
      auVar34 = ZEXT1232(ZEXT412(0)) << 0x20;
      auVar43 = vcmpps_avx(ZEXT1632(auVar67),auVar34,5);
      local_5a60 = vblendvps_avx(auVar55,auVar49,auVar43);
      auVar43 = vmaxps_avx(*(undefined1 (*) [32])(ray + 0x60),auVar34);
      auVar39 = vmaxps_avx(auVar39,auVar34);
      local_5a00 = vpmovsxwd_avx2(auVar53);
      local_4680._8_4_ = 0x7f800000;
      local_4680._0_8_ = 0x7f8000007f800000;
      local_4680._12_4_ = 0x7f800000;
      local_4680._16_4_ = 0x7f800000;
      local_4680._20_4_ = 0x7f800000;
      local_4680._24_4_ = 0x7f800000;
      local_4680._28_4_ = 0x7f800000;
      auVar76 = ZEXT3264(local_4680);
      local_5a40 = vblendvps_avx(local_4680,auVar43,local_5a00);
      auVar43._8_4_ = 0xff800000;
      auVar43._0_8_ = 0xff800000ff800000;
      auVar43._12_4_ = 0xff800000;
      auVar43._16_4_ = 0xff800000;
      auVar43._20_4_ = 0xff800000;
      auVar43._24_4_ = 0xff800000;
      auVar43._28_4_ = 0xff800000;
      local_5a20 = vblendvps_avx(auVar43,auVar39,local_5a00);
      auVar58 = vpcmpeqd_avx(local_5a20._0_16_,local_5a20._0_16_);
      local_5ca0 = vpmovsxwd_avx2(auVar53 ^ auVar58);
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar17 = 7;
      }
      else {
        pRVar16 = context->args;
        uVar17 = (uint)(((ulong)*(Scene **)&pRVar16->flags & 0x10000) == 0) * 5 + 2;
      }
      puVar20 = local_5800;
      local_5810 = 0xfffffffffffffff8;
      pauVar24 = (undefined1 (*) [32])local_4640;
      local_5808 = sVar1;
      local_4660 = local_5a40;
      local_59e0 = mm_lookupmask_ps._16_8_;
      uStack_59d8 = mm_lookupmask_ps._24_8_;
      uStack_59d0 = mm_lookupmask_ps._16_8_;
      uStack_59c8 = mm_lookupmask_ps._24_8_;
      uStack_5ac4 = local_5c20._28_4_;
      uStack_5aa4 = local_5c20._60_4_;
LAB_0060e1e9:
      do {
        do {
          root.ptr = puVar20[-1];
          if (root.ptr == 0xfffffffffffffff8) goto LAB_0060e767;
          puVar20 = puVar20 + -1;
          pauVar24 = pauVar24 + -1;
          local_5c80 = *pauVar24;
          auVar47 = ZEXT3264(local_5c80);
          auVar39 = vcmpps_avx(local_5c80,local_5a20,1);
        } while ((((((((auVar39 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                      (auVar39 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     (auVar39 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    SUB321(auVar39 >> 0x7f,0) == '\0') &&
                   (auVar39 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  SUB321(auVar39 >> 0xbf,0) == '\0') &&
                 (auVar39 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 -1 < auVar39[0x1f]);
        uVar15 = vmovmskps_avx(auVar39);
        pRVar16 = (RTCIntersectArguments *)CONCAT44((int)((ulong)pRVar16 >> 0x20),uVar15);
        if (uVar17 < (uint)POPCOUNT(uVar15)) {
LAB_0060e226:
          do {
            iVar14 = 4;
            lVar21 = 0x38;
            if ((root.ptr & 8) != 0) {
              if ((RTCRayQueryContext *)root.ptr == (RTCRayQueryContext *)0xfffffffffffffff8)
              goto LAB_0060e767;
              auVar39 = vcmpps_avx(local_5a20,auVar47._0_32_,6);
              if ((((((((auVar39 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar39 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar39 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar39 >> 0x7f,0) != '\0') ||
                    (auVar39 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar39 >> 0xbf,0) != '\0') ||
                  (auVar39 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar39[0x1f] < '\0') {
                pRVar16 = (RTCIntersectArguments *)This->leafIntersector;
                local_5c40._8_8_ = uStack_59d8;
                local_5c40._0_8_ = local_59e0;
                local_5c40._16_8_ = uStack_59d0;
                local_5c40._24_8_ = uStack_59c8;
                uVar18 = vmovmskps_avx(local_5ca0);
                if ((uVar18 ^ 0xff) != 0) {
                  local_5c80 = local_5ca0;
                  uVar19 = (ulong)((uVar18 ^ 0xff) & 0xff);
                  pRVar3 = pRVar16 + (ulong)*(byte *)(root.ptr & 0xfffffffffffffff0) * 2 + 1;
                  do {
                    lVar21 = 0;
                    for (uVar23 = uVar19; (uVar23 & 1) == 0;
                        uVar23 = uVar23 >> 1 | 0x8000000000000000) {
                      lVar21 = lVar21 + 1;
                    }
                    pRVar16 = (RTCIntersectArguments *)context;
                    cVar12 = (*(code *)pRVar3->context)
                                       (&local_59c0,ray,lVar21,context,
                                        (byte *)(root.ptr & 0xfffffffffffffff0));
                    if (cVar12 != '\0') {
                      *(undefined4 *)(local_5c40 + lVar21 * 4) = 0xffffffff;
                    }
                    uVar19 = uVar19 - 1 & uVar19;
                  } while (uVar19 != 0);
                  auVar81 = ZEXT3264(local_5c60);
                  auVar83 = ZEXT3264(CONCAT428(0x219392ef,
                                               CONCAT424(0x219392ef,
                                                         CONCAT420(0x219392ef,
                                                                   CONCAT416(0x219392ef,
                                                                             CONCAT412(0x219392ef,
                                                                                       CONCAT48(
                                                  0x219392ef,0x219392ef219392ef)))))));
                  auVar76 = ZEXT3264(CONCAT428(0x7f800000,
                                               CONCAT424(0x7f800000,
                                                         CONCAT420(0x7f800000,
                                                                   CONCAT416(0x7f800000,
                                                                             CONCAT412(0x7f800000,
                                                                                       CONCAT48(
                                                  0x7f800000,0x7f8000007f800000)))))));
                  local_5ca0 = local_5c80;
                }
                local_5ca0 = vorps_avx(local_5c40,local_5ca0);
                auVar39 = _DAT_01fe9960 & ~local_5ca0;
                if ((((((((auVar39 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (auVar39 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar39 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(auVar39 >> 0x7f,0) == '\0') &&
                      (auVar39 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(auVar39 >> 0xbf,0) == '\0') &&
                    (auVar39 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < auVar39[0x1f]) goto LAB_0060e767;
                auVar38._8_4_ = 0xff800000;
                auVar38._0_8_ = 0xff800000ff800000;
                auVar38._12_4_ = 0xff800000;
                auVar38._16_4_ = 0xff800000;
                auVar38._20_4_ = 0xff800000;
                auVar38._24_4_ = 0xff800000;
                auVar38._28_4_ = 0xff800000;
                local_5a20 = vblendvps_avx(local_5a20,auVar38,local_5ca0);
              }
              goto LAB_0060e1e9;
            }
            pRVar16 = (RTCIntersectArguments *)(root.ptr & 0xfffffffffffffff0);
            auVar39 = auVar76._0_32_;
            pRVar22 = (RTCRayQueryContext *)0x8;
            do {
              pRVar2 = *(RTCRayQueryContext **)((long)&pRVar16[-0xe].flags + lVar21 * 8);
              if (pRVar2 == (RTCRayQueryContext *)0x8) {
                auVar47 = ZEXT3264(auVar39);
                break;
              }
              if ((root.ptr & 7) == 0) {
                uVar18 = ((RTCRayQueryContext *)(root.ptr + -0xa0))->instID[lVar21];
                auVar26._4_4_ = uVar18;
                auVar26._0_4_ = uVar18;
                auVar26._8_4_ = uVar18;
                auVar26._12_4_ = uVar18;
                auVar26._16_4_ = uVar18;
                auVar26._20_4_ = uVar18;
                auVar26._24_4_ = uVar18;
                auVar26._28_4_ = uVar18;
                auVar9._4_4_ = fStack_5afc;
                auVar9._0_4_ = local_5b00;
                auVar9._8_4_ = fStack_5af8;
                auVar9._12_4_ = fStack_5af4;
                auVar9._16_4_ = fStack_5af0;
                auVar9._20_4_ = fStack_5aec;
                auVar9._24_4_ = fStack_5ae8;
                auVar9._28_4_ = uStack_5ae4;
                uVar18 = ((RTCRayQueryContext *)(root.ptr + -0x60))->instID[lVar21];
                auVar35._4_4_ = uVar18;
                auVar35._0_4_ = uVar18;
                auVar35._8_4_ = uVar18;
                auVar35._12_4_ = uVar18;
                auVar35._16_4_ = uVar18;
                auVar35._20_4_ = uVar18;
                auVar35._24_4_ = uVar18;
                auVar35._28_4_ = uVar18;
                auVar53 = vfmsub213ps_fma(auVar26,local_5b60,auVar9);
                auVar27 = ZEXT1632(auVar53);
                auVar10._4_4_ = fStack_5adc;
                auVar10._0_4_ = local_5ae0;
                auVar10._8_4_ = fStack_5ad8;
                auVar10._12_4_ = fStack_5ad4;
                auVar10._16_4_ = fStack_5ad0;
                auVar10._20_4_ = fStack_5acc;
                auVar10._24_4_ = fStack_5ac8;
                auVar10._28_4_ = uStack_5ac4;
                uVar18 = ((RTCRayQueryContext *)(root.ptr + -0x20))->instID[lVar21];
                auVar44._4_4_ = uVar18;
                auVar44._0_4_ = uVar18;
                auVar44._8_4_ = uVar18;
                auVar44._12_4_ = uVar18;
                auVar44._16_4_ = uVar18;
                auVar44._20_4_ = uVar18;
                auVar44._24_4_ = uVar18;
                auVar44._28_4_ = uVar18;
                auVar53 = vfmsub213ps_fma(auVar35,local_5b40,auVar10);
                auVar36 = ZEXT1632(auVar53);
                auVar11._4_4_ = fStack_5abc;
                auVar11._0_4_ = local_5ac0;
                auVar11._8_4_ = fStack_5ab8;
                auVar11._12_4_ = fStack_5ab4;
                auVar11._16_4_ = fStack_5ab0;
                auVar11._20_4_ = fStack_5aac;
                auVar11._24_4_ = fStack_5aa8;
                auVar11._28_4_ = uStack_5aa4;
                uVar18 = ((RTCRayQueryContext *)(root.ptr + -0x80))->instID[lVar21];
                auVar50._4_4_ = uVar18;
                auVar50._0_4_ = uVar18;
                auVar50._8_4_ = uVar18;
                auVar50._12_4_ = uVar18;
                auVar50._16_4_ = uVar18;
                auVar50._20_4_ = uVar18;
                auVar50._24_4_ = uVar18;
                auVar50._28_4_ = uVar18;
                auVar53 = vfmsub213ps_fma(auVar44,local_5b20,auVar11);
                auVar46 = ZEXT1632(auVar53);
                auVar48 = vfmsub213ps_fma(auVar50,local_5b60,auVar9);
                uVar18 = ((RTCRayQueryContext *)(root.ptr + -0x40))->instID[lVar21];
                auVar56._4_4_ = uVar18;
                auVar56._0_4_ = uVar18;
                auVar56._8_4_ = uVar18;
                auVar56._12_4_ = uVar18;
                auVar56._16_4_ = uVar18;
                auVar56._20_4_ = uVar18;
                auVar56._24_4_ = uVar18;
                auVar56._28_4_ = uVar18;
                auVar53 = vfmsub213ps_fma(auVar56,local_5b40,auVar10);
                uVar18 = ((RTCRayQueryContext *)root.ptr)->instID[lVar21];
                auVar62._4_4_ = uVar18;
                auVar62._0_4_ = uVar18;
                auVar62._8_4_ = uVar18;
                auVar62._12_4_ = uVar18;
                auVar62._16_4_ = uVar18;
                auVar62._20_4_ = uVar18;
                auVar62._24_4_ = uVar18;
                auVar62._28_4_ = uVar18;
                auVar59 = vfmsub213ps_fma(auVar62,local_5b20,auVar11);
              }
              else {
                uVar15 = *(undefined4 *)((long)&pRVar16[-5].flags + lVar21 * 4);
                auVar57._4_4_ = uVar15;
                auVar57._0_4_ = uVar15;
                auVar57._8_4_ = uVar15;
                auVar57._12_4_ = uVar15;
                auVar57._16_4_ = uVar15;
                auVar57._20_4_ = uVar15;
                auVar57._24_4_ = uVar15;
                auVar57._28_4_ = uVar15;
                uVar15 = *(undefined4 *)((long)&pRVar16[-4].flags + lVar21 * 4);
                auVar37._4_4_ = uVar15;
                auVar37._0_4_ = uVar15;
                auVar37._8_4_ = uVar15;
                auVar37._12_4_ = uVar15;
                auVar37._16_4_ = uVar15;
                auVar37._20_4_ = uVar15;
                auVar37._24_4_ = uVar15;
                auVar37._28_4_ = uVar15;
                uVar15 = *(undefined4 *)((long)&pRVar16[-3].flags + lVar21 * 4);
                auVar28._4_4_ = uVar15;
                auVar28._0_4_ = uVar15;
                auVar28._8_4_ = uVar15;
                auVar28._12_4_ = uVar15;
                auVar28._16_4_ = uVar15;
                auVar28._20_4_ = uVar15;
                auVar28._24_4_ = uVar15;
                auVar28._28_4_ = uVar15;
                uVar15 = *(undefined4 *)((long)&pRVar16[-2].flags + lVar21 * 4);
                auVar68._4_4_ = uVar15;
                auVar68._0_4_ = uVar15;
                auVar68._8_4_ = uVar15;
                auVar68._12_4_ = uVar15;
                auVar68._16_4_ = uVar15;
                auVar68._20_4_ = uVar15;
                auVar68._24_4_ = uVar15;
                auVar68._28_4_ = uVar15;
                uVar15 = *(undefined4 *)((long)&pRVar16[-1].flags + lVar21 * 4);
                auVar66._4_4_ = uVar15;
                auVar66._0_4_ = uVar15;
                auVar66._8_4_ = uVar15;
                auVar66._12_4_ = uVar15;
                auVar66._16_4_ = uVar15;
                auVar66._20_4_ = uVar15;
                auVar66._24_4_ = uVar15;
                auVar66._28_4_ = uVar15;
                uVar15 = *(undefined4 *)((long)&pRVar16->flags + lVar21 * 4);
                auVar65._4_4_ = uVar15;
                auVar65._0_4_ = uVar15;
                auVar65._8_4_ = uVar15;
                auVar65._12_4_ = uVar15;
                auVar65._16_4_ = uVar15;
                auVar65._20_4_ = uVar15;
                auVar65._24_4_ = uVar15;
                auVar65._28_4_ = uVar15;
                fVar25 = *(float *)((long)&pRVar16[1].flags + lVar21 * 4);
                auVar72._4_4_ = fVar25;
                auVar72._0_4_ = fVar25;
                auVar72._8_4_ = fVar25;
                auVar72._12_4_ = fVar25;
                auVar72._16_4_ = fVar25;
                auVar72._20_4_ = fVar25;
                auVar72._24_4_ = fVar25;
                auVar72._28_4_ = fVar25;
                fVar30 = *(float *)((long)&pRVar16[2].flags + lVar21 * 4);
                auVar75._4_4_ = fVar30;
                auVar75._0_4_ = fVar30;
                auVar75._8_4_ = fVar30;
                auVar75._12_4_ = fVar30;
                auVar75._16_4_ = fVar30;
                auVar75._20_4_ = fVar30;
                auVar75._24_4_ = fVar30;
                auVar75._28_4_ = fVar30;
                fVar31 = *(float *)((long)&pRVar16[3].flags + lVar21 * 4);
                auVar78._4_4_ = fVar31;
                auVar78._0_4_ = fVar31;
                auVar78._8_4_ = fVar31;
                auVar78._12_4_ = fVar31;
                auVar78._16_4_ = fVar31;
                auVar78._20_4_ = fVar31;
                auVar78._24_4_ = fVar31;
                auVar78._28_4_ = fVar31;
                uVar15 = *(undefined4 *)((long)&pRVar16[4].flags + lVar21 * 4);
                auVar63._4_4_ = uVar15;
                auVar63._0_4_ = uVar15;
                auVar63._8_4_ = uVar15;
                auVar63._12_4_ = uVar15;
                auVar63._16_4_ = uVar15;
                auVar63._20_4_ = uVar15;
                auVar63._24_4_ = uVar15;
                auVar63._28_4_ = uVar15;
                uVar15 = *(undefined4 *)((long)&pRVar16[5].flags + lVar21 * 4);
                auVar51._4_4_ = uVar15;
                auVar51._0_4_ = uVar15;
                auVar51._8_4_ = uVar15;
                auVar51._12_4_ = uVar15;
                auVar51._16_4_ = uVar15;
                auVar51._20_4_ = uVar15;
                auVar51._24_4_ = uVar15;
                auVar51._28_4_ = uVar15;
                uVar15 = *(undefined4 *)((long)&pRVar16[6].flags + lVar21 * 4);
                auVar45._4_4_ = uVar15;
                auVar45._0_4_ = uVar15;
                auVar45._8_4_ = uVar15;
                auVar45._12_4_ = uVar15;
                auVar45._16_4_ = uVar15;
                auVar45._20_4_ = uVar15;
                auVar45._24_4_ = uVar15;
                auVar45._28_4_ = uVar15;
                auVar53 = vfmadd231ps_fma(auVar63,(undefined1  [32])local_5c20.field_0.z.field_0,
                                          auVar72);
                auVar58 = vfmadd231ps_fma(auVar51,(undefined1  [32])local_5c20.field_0.z.field_0,
                                          auVar75);
                auVar52 = vfmadd231ps_fma(auVar45,(undefined1  [32])local_5c20.field_0.z.field_0,
                                          auVar78);
                auVar4._4_4_ = fVar25 * (float)local_5b80._4_4_;
                auVar4._0_4_ = fVar25 * (float)local_5b80._0_4_;
                auVar4._8_4_ = fVar25 * fStack_5b78;
                auVar4._12_4_ = fVar25 * fStack_5b74;
                auVar4._16_4_ = fVar25 * fStack_5b70;
                auVar4._20_4_ = fVar25 * fStack_5b6c;
                auVar4._24_4_ = fVar25 * fStack_5b68;
                auVar4._28_4_ = fVar25;
                auVar5._4_4_ = fVar30 * (float)local_5b80._4_4_;
                auVar5._0_4_ = fVar30 * (float)local_5b80._0_4_;
                auVar5._8_4_ = fVar30 * fStack_5b78;
                auVar5._12_4_ = fVar30 * fStack_5b74;
                auVar5._16_4_ = fVar30 * fStack_5b70;
                auVar5._20_4_ = fVar30 * fStack_5b6c;
                auVar5._24_4_ = fVar30 * fStack_5b68;
                auVar5._28_4_ = fVar30;
                auVar6._4_4_ = fVar31 * (float)local_5b80._4_4_;
                auVar6._0_4_ = fVar31 * (float)local_5b80._0_4_;
                auVar6._8_4_ = fVar31 * fStack_5b78;
                auVar6._12_4_ = fVar31 * fStack_5b74;
                auVar6._16_4_ = fVar31 * fStack_5b70;
                auVar6._20_4_ = fVar31 * fStack_5b6c;
                auVar6._24_4_ = fVar31 * fStack_5b68;
                auVar6._28_4_ = fVar31;
                auVar67 = vfmadd231ps_fma(auVar4,local_5ba0,auVar68);
                auVar77 = vfmadd231ps_fma(auVar5,local_5ba0,auVar66);
                auVar73 = vfmadd231ps_fma(auVar6,auVar65,local_5ba0);
                auVar67 = vfmadd231ps_fma(ZEXT1632(auVar67),local_5bc0,auVar57);
                auVar77 = vfmadd231ps_fma(ZEXT1632(auVar77),local_5bc0,auVar37);
                auVar73 = vfmadd231ps_fma(ZEXT1632(auVar73),auVar28,local_5bc0);
                auVar49 = auVar81._0_32_;
                auVar43 = vandps_avx(ZEXT1632(auVar67),auVar49);
                auVar54 = auVar83._0_32_;
                auVar43 = vcmpps_avx(auVar43,auVar54,1);
                auVar34 = vblendvps_avx(ZEXT1632(auVar67),auVar54,auVar43);
                auVar43 = vandps_avx(ZEXT1632(auVar77),auVar49);
                auVar43 = vcmpps_avx(auVar43,auVar54,1);
                auVar64 = vblendvps_avx(ZEXT1632(auVar77),auVar54,auVar43);
                auVar43 = vandps_avx(ZEXT1632(auVar73),auVar49);
                auVar43 = vcmpps_avx(auVar43,auVar54,1);
                auVar43 = vblendvps_avx(ZEXT1632(auVar73),auVar54,auVar43);
                auVar8._4_4_ = local_5c20._36_4_;
                auVar8._0_4_ = local_5c20._32_4_;
                auVar8._8_4_ = local_5c20._40_4_;
                auVar8._12_4_ = local_5c20._44_4_;
                auVar8._16_4_ = local_5c20._48_4_;
                auVar8._20_4_ = local_5c20._52_4_;
                auVar8._24_4_ = local_5c20._56_4_;
                auVar8._28_4_ = local_5c20._60_4_;
                auVar67 = vfmadd231ps_fma(ZEXT1632(auVar53),auVar8,auVar68);
                auVar77 = vfmadd231ps_fma(ZEXT1632(auVar58),auVar8,auVar66);
                auVar49 = vrcpps_avx(auVar34);
                auVar73 = vfmadd231ps_fma(ZEXT1632(auVar52),auVar8,auVar65);
                auVar54 = vrcpps_avx(auVar64);
                auVar69._8_4_ = 0x3f800000;
                auVar69._0_8_ = 0x3f8000003f800000;
                auVar69._12_4_ = 0x3f800000;
                auVar69._16_4_ = 0x3f800000;
                auVar69._20_4_ = 0x3f800000;
                auVar69._24_4_ = 0x3f800000;
                auVar69._28_4_ = 0x3f800000;
                auVar53 = vfnmadd213ps_fma(auVar34,auVar49,auVar69);
                auVar53 = vfmadd132ps_fma(ZEXT1632(auVar53),auVar49,auVar49);
                auVar58 = vfnmadd213ps_fma(auVar64,auVar54,auVar69);
                auVar58 = vfmadd132ps_fma(ZEXT1632(auVar58),auVar54,auVar54);
                auVar34 = vrcpps_avx(auVar43);
                auVar52 = vfnmadd213ps_fma(auVar43,auVar34,auVar69);
                auVar52 = vfmadd132ps_fma(ZEXT1632(auVar52),auVar34,auVar34);
                auVar7._4_4_ = local_5c20._4_4_;
                auVar7._0_4_ = local_5c20._0_4_;
                auVar7._8_4_ = local_5c20._8_4_;
                auVar7._12_4_ = local_5c20._12_4_;
                auVar7._16_4_ = local_5c20._16_4_;
                auVar7._20_4_ = local_5c20._20_4_;
                auVar7._24_4_ = local_5c20._24_4_;
                auVar7._28_4_ = local_5c20._28_4_;
                auVar67 = vfmadd231ps_fma(ZEXT1632(auVar67),auVar7,auVar57);
                auVar77 = vfmadd231ps_fma(ZEXT1632(auVar77),auVar7,auVar37);
                auVar73 = vfmadd231ps_fma(ZEXT1632(auVar73),auVar7,auVar28);
                fVar25 = auVar67._0_4_ * -auVar53._0_4_;
                fVar30 = auVar67._4_4_ * -auVar53._4_4_;
                auVar27._4_4_ = fVar30;
                auVar27._0_4_ = fVar25;
                fVar31 = auVar67._8_4_ * -auVar53._8_4_;
                auVar27._8_4_ = fVar31;
                fVar32 = auVar67._12_4_ * -auVar53._12_4_;
                auVar27._12_4_ = fVar32;
                auVar27._16_4_ = 0x80000000;
                auVar27._20_4_ = 0x80000000;
                auVar27._24_4_ = 0x80000000;
                auVar27._28_4_ = 0x80000000;
                fVar33 = auVar77._0_4_ * -auVar58._0_4_;
                fVar40 = auVar77._4_4_ * -auVar58._4_4_;
                auVar36._4_4_ = fVar40;
                auVar36._0_4_ = fVar33;
                fVar41 = auVar77._8_4_ * -auVar58._8_4_;
                auVar36._8_4_ = fVar41;
                fVar42 = auVar77._12_4_ * -auVar58._12_4_;
                auVar36._12_4_ = fVar42;
                auVar36._16_4_ = 0x80000000;
                auVar36._20_4_ = 0x80000000;
                auVar36._24_4_ = 0x80000000;
                auVar36._28_4_ = 0x80000000;
                auVar46._0_4_ = auVar73._0_4_ * -auVar52._0_4_;
                auVar46._4_4_ = auVar73._4_4_ * -auVar52._4_4_;
                auVar46._8_4_ = auVar73._8_4_ * -auVar52._8_4_;
                auVar46._12_4_ = auVar73._12_4_ * -auVar52._12_4_;
                auVar46._16_4_ = 0x80000000;
                auVar46._20_4_ = 0x80000000;
                auVar46._24_4_ = 0x80000000;
                auVar46._28_4_ = 0;
                auVar48._0_4_ = auVar53._0_4_ + fVar25;
                auVar48._4_4_ = auVar53._4_4_ + fVar30;
                auVar48._8_4_ = auVar53._8_4_ + fVar31;
                auVar48._12_4_ = auVar53._12_4_ + fVar32;
                auVar53._0_4_ = auVar58._0_4_ + fVar33;
                auVar53._4_4_ = auVar58._4_4_ + fVar40;
                auVar53._8_4_ = auVar58._8_4_ + fVar41;
                auVar53._12_4_ = auVar58._12_4_ + fVar42;
                auVar76 = ZEXT3264(CONCAT428(0x7f800000,
                                             CONCAT424(0x7f800000,
                                                       CONCAT420(0x7f800000,
                                                                 CONCAT416(0x7f800000,
                                                                           CONCAT412(0x7f800000,
                                                                                     CONCAT48(
                                                  0x7f800000,0x7f8000007f800000)))))));
                auVar59._0_4_ = auVar52._0_4_ + auVar46._0_4_;
                auVar59._4_4_ = auVar52._4_4_ + auVar46._4_4_;
                auVar59._8_4_ = auVar52._8_4_ + auVar46._8_4_;
                auVar59._12_4_ = auVar52._12_4_ + auVar46._12_4_;
              }
              auVar43 = vpminsd_avx2(auVar27,ZEXT1632(auVar48));
              auVar34 = vpminsd_avx2(auVar36,ZEXT1632(auVar53));
              auVar43 = vpmaxsd_avx2(auVar43,auVar34);
              auVar34 = vpminsd_avx2(auVar46,ZEXT1632(auVar59));
              auVar34 = vpmaxsd_avx2(auVar43,auVar34);
              auVar43 = vpmaxsd_avx2(auVar27,ZEXT1632(auVar48));
              auVar64 = vpmaxsd_avx2(auVar36,ZEXT1632(auVar53));
              auVar64 = vpminsd_avx2(auVar43,auVar64);
              auVar43 = vpmaxsd_avx2(auVar46,ZEXT1632(auVar59));
              auVar64 = vpminsd_avx2(auVar64,auVar43);
              auVar43 = vpmaxsd_avx2(auVar34,local_5a40);
              auVar64 = vpminsd_avx2(auVar64,local_5a20);
              auVar43 = vcmpps_avx(auVar43,auVar64,2);
              if ((((((((auVar43 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar43 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar43 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar43 >> 0x7f,0) == '\0') &&
                    (auVar43 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar43 >> 0xbf,0) == '\0') &&
                  (auVar43 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar43[0x1f]) {
                auVar47 = ZEXT3264(auVar39);
                pRVar2 = pRVar22;
              }
              else {
                auVar43 = vblendvps_avx(auVar76._0_32_,auVar34,auVar43);
                auVar47 = ZEXT3264(auVar43);
                if (pRVar22 != (RTCRayQueryContext *)0x8) {
                  *puVar20 = (ulong)pRVar22;
                  puVar20 = puVar20 + 1;
                  *pauVar24 = auVar39;
                  pauVar24 = pauVar24 + 1;
                }
              }
              pRVar22 = pRVar2;
              lVar21 = lVar21 + 1;
              auVar39 = auVar47._0_32_;
            } while (lVar21 != 0x40);
            pRVar3 = pRVar16;
            if (pRVar22 == (RTCRayQueryContext *)0x8) goto LAB_0060e547;
            auVar39 = vcmpps_avx(local_5a20,auVar47._0_32_,6);
            uVar15 = vmovmskps_avx(auVar39);
            root.ptr = (size_t)pRVar22;
          } while ((byte)uVar17 < (byte)POPCOUNT(uVar15));
          *puVar20 = (ulong)pRVar22;
          puVar20 = puVar20 + 1;
          *pauVar24 = auVar47._0_32_;
          pauVar24 = pauVar24 + 1;
        }
        else {
          for (; pRVar16 != (RTCIntersectArguments *)0x0;
              pRVar16 = (RTCIntersectArguments *)
                        ((ulong)((long)&pRVar16[-1].intersect + 7U) & (ulong)pRVar16)) {
            sVar1 = 0;
            for (pRVar3 = pRVar16; ((ulong)pRVar3 & 1) == 0;
                pRVar3 = (RTCIntersectArguments *)((ulong)pRVar3 >> 1 | 0x8000000000000000)) {
              sVar1 = sVar1 + 1;
            }
            bVar13 = occluded1(This,bvh,root,sVar1,(Precalculations *)&local_59c0,ray,
                               (TravRayK<8,_false> *)&local_5c20.field_0,context);
            if (bVar13) {
              *(undefined4 *)(local_5ca0 + sVar1 * 4) = 0xffffffff;
            }
            auVar81 = ZEXT3264(local_5c60);
            auVar83 = ZEXT3264(CONCAT428(0x219392ef,
                                         CONCAT424(0x219392ef,
                                                   CONCAT420(0x219392ef,
                                                             CONCAT416(0x219392ef,
                                                                       CONCAT412(0x219392ef,
                                                                                 CONCAT48(0x219392ef
                                                                                          ,
                                                  0x219392ef219392ef)))))));
            auVar76 = ZEXT3264(CONCAT428(0x7f800000,
                                         CONCAT424(0x7f800000,
                                                   CONCAT420(0x7f800000,
                                                             CONCAT416(0x7f800000,
                                                                       CONCAT412(0x7f800000,
                                                                                 CONCAT48(0x7f800000
                                                                                          ,
                                                  0x7f8000007f800000)))))));
            auVar47 = ZEXT3264(local_5c80);
          }
          auVar39 = _DAT_01fe9960 & ~local_5ca0;
          iVar14 = 3;
          if ((((((((auVar39 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar39 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar39 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar39 >> 0x7f,0) != '\0') ||
                (auVar39 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar39 >> 0xbf,0) != '\0') ||
              (auVar39 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar39[0x1f] < '\0') {
            auVar39._8_4_ = 0xff800000;
            auVar39._0_8_ = 0xff800000ff800000;
            auVar39._12_4_ = 0xff800000;
            auVar39._16_4_ = 0xff800000;
            auVar39._20_4_ = 0xff800000;
            auVar39._24_4_ = 0xff800000;
            auVar39._28_4_ = 0xff800000;
            local_5a20 = vblendvps_avx(local_5a20,auVar39,local_5ca0);
            iVar14 = 2;
          }
          pRVar16 = (RTCIntersectArguments *)0x0;
          pRVar3 = (RTCIntersectArguments *)0x0;
          if (uVar17 < (uint)POPCOUNT(uVar15)) goto LAB_0060e226;
        }
LAB_0060e547:
        pRVar16 = pRVar3;
      } while (iVar14 != 3);
LAB_0060e767:
      auVar39 = vandps_avx(local_5a00,local_5ca0);
      auVar29._8_4_ = 0xff800000;
      auVar29._0_8_ = 0xff800000ff800000;
      auVar29._12_4_ = 0xff800000;
      auVar29._16_4_ = 0xff800000;
      auVar29._20_4_ = 0xff800000;
      auVar29._24_4_ = 0xff800000;
      auVar29._28_4_ = 0xff800000;
      auVar39 = vmaskmovps_avx(auVar39,auVar29);
      *(undefined1 (*) [32])(ray + 0x100) = auVar39;
      return;
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }